

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::CheckOpcode1(TypeChecker *this,Opcode opcode)

{
  Result RVar1;
  Opcode local_54;
  char *local_50;
  Type local_40;
  Type local_3c;
  
  local_54.enum_ = opcode.enum_;
  Opcode::GetInfo(&local_54);
  Opcode::GetInfo(&local_54);
  RVar1 = PopAndCheck1Type(this,local_3c,local_50);
  Opcode::GetInfo(&local_54);
  PushType(this,local_40);
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::CheckOpcode1(Opcode opcode) {
  Result result = PopAndCheck1Type(opcode.GetParamType1(), opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}